

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O2

int __thiscall booster::aio::stream_socket::shutdown(stream_socket *this,int __fd,int __how)

{
  native_type __fd_00;
  int iVar1;
  undefined4 in_register_00000014;
  error_code eVar2;
  
  if (__fd != 2) {
    __fd = (int)(__fd == 1);
  }
  __fd_00 = basic_io_device::native((basic_io_device *)this);
  iVar1 = ::shutdown(__fd_00,__fd);
  if (iVar1 < 0) {
    eVar2 = socket_details::geterror();
    iVar1 = eVar2._M_value;
    *(int *)CONCAT44(in_register_00000014,__how) = iVar1;
    *(error_category **)((int *)CONCAT44(in_register_00000014,__how) + 2) = eVar2._M_cat;
  }
  return iVar1;
}

Assistant:

void stream_socket::shutdown(how_type how,system::error_code &e)
{
	#ifndef SHUT_RDWR
	#define SHUT_RDWR SD_BOTH
	#endif
	#ifndef SHUT_WR
	#define SHUT_WR SD_SEND
	#endif
	#ifndef SHUT_RD
	#define SHUT_RD SD_RECEIVE
	#endif
	int method = 0;
	switch(how) {
	case shut_rd: method = SHUT_RD; break;
	case shut_wr: method = SHUT_WR; break;
	case shut_rdwr: method = SHUT_RDWR; break;
	}

	int res = ::shutdown(native(),method);
	if(res < 0)
		e=geterror();
}